

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

void test2(void)

{
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> i;
  optional<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mtak_[P]haskell_traits_test_basic_tests_cpp:134:26)>
  f;
  anon_class_1_0_00000001_for__M_value foo;
  optional<float> b;
  S local_138;
  R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  local_118;
  optional<int> local_f0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  S local_88;
  R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  local_68;
  optional<int> local_40;
  undefined1 local_38 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> xs;
  optional<int> x;
  
  xs.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
  xs.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._33_7_ = 0x1000000;
  bindShowInt<const_std::optional<int>_&,_42,_42>(&local_40);
  haskell_traits::v1::
  lazy<haskell_traits::v1::merged_return<haskell_traits::v1::fmap_fn,_haskell_traits::v1::aapply_fn,_haskell_traits::v1::mbind_fn>,_std::optional<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp:52:17)>
  ::
  operator_optional<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_42,_42>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38,
             (lazy<haskell_traits::v1::merged_return<haskell_traits::v1::fmap_fn,_haskell_traits::v1::aapply_fn,_haskell_traits::v1::mbind_fn>,_std::optional<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mtak_[P]haskell_traits_test_basic_tests_cpp:52:17)>
              *)&local_40);
  test_impl::S::S(&local_88,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp"
                  ,0x7e,"xs == std::string(\"4\")","void test2()");
  test_impl::S::operator->*
            (&local_68,&local_88,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"4",&local_b9);
  test_impl::R<std::optional<std::__cxx11::string>&>::operator==
            ((R<std::optional<std::__cxx11::string>&> *)&local_68,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  test_impl::
  R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::~R(&local_68);
  bindShowSizeof<const_std::optional<int>_&,_42,_42>(&local_f0);
  haskell_traits::v1::
  lazy<haskell_traits::v1::merged_return<haskell_traits::v1::fmap_fn,_haskell_traits::v1::aapply_fn,_haskell_traits::v1::mbind_fn>,_std::optional<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp:59:17)>
  ::
  operator_optional<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_42,_42>
            (&local_e8,
             (lazy<haskell_traits::v1::merged_return<haskell_traits::v1::fmap_fn,_haskell_traits::v1::aapply_fn,_haskell_traits::v1::mbind_fn>,_std::optional<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mtak_[P]haskell_traits_test_basic_tests_cpp:59:17)>
              *)&local_f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_38,&local_e8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_e8);
  test_impl::S::S(&local_138,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp"
                  ,0x81,"xs == std::to_string(sizeof(int))","void test2()");
  test_impl::S::operator->*
            (&local_118,&local_138,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38);
  std::__cxx11::to_string((string *)&b,4);
  test_impl::R<std::optional<std::__cxx11::string>&>::operator==
            ((R<std::optional<std::__cxx11::string>&> *)&local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b);
  std::__cxx11::string::~string((string *)&b);
  test_impl::
  R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::~R(&local_118);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_38);
  return;
}

Assistant:

void test2()
{
    constexpr std::optional<int> x{4};
    std::optional<std::string>   xs = bindShowInt(x);
    CHECK(xs == std::string("4"));

    xs = bindShowSizeof(x);
    CHECK(xs == std::to_string(sizeof(int)));

    constexpr std::optional<float> b = ht::fmap(x, [](const int y) { return float(y); });
    static_assert(b == float(4));

    constexpr auto foo = [](std::string_view x) constexpr->int { return x.size(); };
    constexpr std::optional<decltype(foo)>    f{foo};
    constexpr std::optional<std::string_view> i{"foobar"};
    static_assert(ht::aapply(i, f) == 6);
    static_assert(i >> f == 6);
}